

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::initTestMessage(Builder builder)

{
  byte *pbVar1;
  initializer_list<int> value;
  initializer_list<int> value_00;
  initializer_list<int> value_01;
  initializer_list<capnp::Text::Reader> value_02;
  initializer_list<capnp::Text::Reader> value_03;
  initializer_list<capnp::Text::Reader> value_04;
  Reader value_05;
  Reader value_06;
  Builder l;
  Builder e;
  StructBuilder local_b0;
  Builder local_88;
  Builder lists;
  
  local_88._builder.dataSize = builder._builder.dataSize;
  local_88._builder.pointerCount = builder._builder.pointerCount;
  local_88._builder._38_2_ = builder._builder._38_2_;
  local_88._builder.data = builder._builder.data;
  local_88._builder.pointers = builder._builder.pointers;
  local_88._builder.segment = builder._builder.segment;
  local_88._builder.capTable = builder._builder.capTable;
  capnproto_test::capnp::test::TestListDefaults::Builder::initLists(&lists,&local_88);
  capnproto_test::capnp::test::TestLists::Builder::initList0((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::initList1((Builder *)&l,&lists,4);
  capnproto_test::capnp::test::TestLists::Builder::initList8((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::initList16((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::initList32((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::initList64((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::initListP((Builder *)&l,&lists,2);
  capnproto_test::capnp::test::TestLists::Builder::getList0((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  capnproto_test::capnp::test::TestLists::Builder::getList0((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  *l.builder.ptr = *l.builder.ptr | 1;
  capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  *l.builder.ptr = *l.builder.ptr & 0xfe;
  capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,2);
  *l.builder.ptr = *l.builder.ptr | 1;
  capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,3);
  *l.builder.ptr = *l.builder.ptr | 1;
  capnproto_test::capnp::test::TestLists::Builder::getList8((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  *l.builder.ptr = '{';
  capnproto_test::capnp::test::TestLists::Builder::getList8((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  *l.builder.ptr = '-';
  capnproto_test::capnp::test::TestLists::Builder::getList16((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  l.builder.ptr[0] = '9';
  l.builder.ptr[1] = '0';
  capnproto_test::capnp::test::TestLists::Builder::getList16((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  l.builder.ptr[0] = 0x85;
  l.builder.ptr[1] = '\x1a';
  capnproto_test::capnp::test::TestLists::Builder::getList32((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  l.builder.ptr[0] = '\x15';
  l.builder.ptr[1] = 0xcd;
  l.builder.ptr[2] = '[';
  l.builder.ptr[3] = '\a';
  capnproto_test::capnp::test::TestLists::Builder::getList32((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  l.builder.ptr[0] = 0xd2;
  l.builder.ptr[1] = '8';
  l.builder.ptr[2] = 0xfb;
  l.builder.ptr[3] = '\r';
  capnproto_test::capnp::test::TestLists::Builder::getList64((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  l.builder.ptr[0] = 0xc0;
  l.builder.ptr[1] = 0xba;
  l.builder.ptr[2] = 0x8a;
  l.builder.ptr[3] = '<';
  l.builder.ptr[4] = 0xd5;
  l.builder.ptr[5] = 'b';
  l.builder.ptr[6] = '\x04';
  l.builder.ptr[7] = '\0';
  capnproto_test::capnp::test::TestLists::Builder::getList64((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  l.builder.ptr[0] = 0x87;
  l.builder.ptr[1] = 'K';
  l.builder.ptr[2] = 0xaa;
  l.builder.ptr[3] = 0xed;
  l.builder.ptr[4] = 'a';
  l.builder.ptr[5] = 'U';
  l.builder.ptr[6] = '\b';
  l.builder.ptr[7] = '\0';
  capnproto_test::capnp::test::TestLists::Builder::getListP((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,0);
  value_05.super_StringPtr.content.size_ = 4;
  value_05.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&l,value_05);
  capnproto_test::capnp::test::TestLists::Builder::getListP((Builder *)&e.builder,&lists);
  ListBuilder::getStructElement((StructBuilder *)&l,&e.builder,1);
  value_06.super_StringPtr.content.size_ = 4;
  value_06.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&l,value_06);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList(&l,&lists,3);
  e.builder.segment = (SegmentBuilder *)0x200000001;
  e.builder.capTable = (CapTableBuilder *)CONCAT44(e.builder.capTable._4_4_,3);
  value._M_len = 3;
  value._M_array = (iterator)&e;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set(&l,0,value);
  e.builder.segment = (SegmentBuilder *)0x500000004;
  value_00._M_len = 2;
  value_00._M_array = (iterator)&e;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set(&l,1,value_00);
  e.builder.segment = (SegmentBuilder *)CONCAT44(e.builder.segment._4_4_,0xbc4ff2);
  value_01._M_len = 1;
  value_01._M_array = (iterator)&e;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set(&l,2,value_01);
  capnproto_test::capnp::test::TestLists::Builder::initTextListList((Builder *)&l,&lists,3);
  e.builder.segment = (SegmentBuilder *)0x4f93d8;
  e.builder.capTable = (CapTableBuilder *)0x4;
  e.builder.ptr = "bar";
  e.builder.elementCount = 4;
  e.builder.step = 0;
  value_02._M_len = 2;
  value_02._M_array = (iterator)&e;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&l,0,value_02);
  e.builder.segment = (SegmentBuilder *)0x518f2f;
  e.builder.capTable = (CapTableBuilder *)0x4;
  value_03._M_len = 1;
  value_03._M_array = (iterator)&e;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&l,1,value_03);
  e.builder.segment = (SegmentBuilder *)0x500e65;
  e.builder.capTable = (CapTableBuilder *)0x4;
  e.builder.ptr = "corge";
  e.builder.elementCount = 6;
  e.builder.step = 0;
  value_04._M_len = 2;
  value_04._M_array = (iterator)&e;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&l,2,value_04);
  capnproto_test::capnp::test::TestLists::Builder::initStructListList((Builder *)&l,&lists,2);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init((Builder *)&e.builder,(EVP_PKEY_CTX *)&l);
  ListBuilder::getStructElement(&local_b0,&e.builder,0);
  pbVar1 = (byte *)((long)local_b0.data + 4);
  pbVar1[0] = '{';
  pbVar1[1] = '\0';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  ListBuilder::getStructElement(&local_b0,&e.builder,1);
  pbVar1 = (byte *)((long)local_b0.data + 4);
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init((Builder *)&local_b0,(EVP_PKEY_CTX *)&l);
  e.builder.structDataSize = local_b0.dataSize;
  e.builder.structPointerCount = local_b0.pointerCount;
  e.builder.elementSize = local_b0._38_1_;
  e.builder._39_1_ = local_b0._39_1_;
  e.builder.ptr = (byte *)local_b0.data;
  e.builder._24_8_ = local_b0.pointers;
  e.builder.segment = local_b0.segment;
  e.builder.capTable = local_b0.capTable;
  ListBuilder::getStructElement(&local_b0,&e.builder,0);
  pbVar1 = (byte *)((long)local_b0.data + 4);
  pbVar1[0] = '\x15';
  pbVar1[1] = '\x03';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  return;
}

Assistant:

void initTestMessage(TestListDefaults::Builder builder) { genericInitListDefaults(builder); }